

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

pair<const_slang::ast::ClassType_*,_bool> slang::ast::Lookup::getContainingClass(Scope *scope)

{
  SymbolKind SVar1;
  ClassType *pCVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  pair<const_slang::ast::ClassType_*,_bool> pVar6;
  
  uVar3 = 0;
  do {
    pCVar2 = (ClassType *)scope->thisSym;
    SVar1 = (pCVar2->super_Type).super_Symbol.kind;
    uVar4 = (ulong)(SVar1 - StatementBlock);
    if (SVar1 - StatementBlock < 0x23) {
      if ((0x780004001U >> (uVar4 & 0x3f) & 1) == 0) {
        lVar5 = 0xc4;
        if (uVar4 != 6) {
          if (uVar4 != 10) goto LAB_003cc21c;
          lVar5 = 0xc0;
        }
        if ((*(byte *)((long)&(pCVar2->super_Type).super_Symbol.kind + lVar5) & 4) != 0) {
          uVar3 = 1;
        }
      }
    }
    else {
LAB_003cc21c:
      if (SVar1 != CovergroupType) {
        if (SVar1 != ClassType) {
          pCVar2 = (ClassType *)0x0;
        }
        pVar6._8_8_ = uVar3;
        pVar6.first = pCVar2;
        return pVar6;
      }
    }
    scope = (pCVar2->super_Type).super_Symbol.parentScope;
  } while( true );
}

Assistant:

std::pair<const ClassType*, bool> Lookup::getContainingClass(const Scope& scope) {
    auto isClassElem = [](SymbolKind kind) {
        switch (kind) {
            case SymbolKind::StatementBlock:
            case SymbolKind::Subroutine:
            case SymbolKind::MethodPrototype:
            case SymbolKind::ConstraintBlock:
            case SymbolKind::RandSeqProduction:
            case SymbolKind::CovergroupBody:
            case SymbolKind::CovergroupType:
            case SymbolKind::Coverpoint:
            case SymbolKind::CoverCross:
                return true;
            default:
                return false;
        }
    };

    const Symbol* parent = &scope.asSymbol();
    bool inStatic = false;
    while (isClassElem(parent->kind)) {
        if (parent->kind == SymbolKind::Subroutine) {
            // Remember whether this was a static class method.
            if (parent->as<SubroutineSymbol>().flags.has(MethodFlags::Static))
                inStatic = true;
        }
        else if (parent->kind == SymbolKind::MethodPrototype) {
            if (parent->as<MethodPrototypeSymbol>().flags.has(MethodFlags::Static))
                inStatic = true;
        }

        auto parentScope = parent->getParentScope();
        SLANG_ASSERT(parentScope);
        parent = &parentScope->asSymbol();
    }

    if (parent->kind == SymbolKind::ClassType)
        return {&parent->as<ClassType>(), inStatic};

    return {nullptr, inStatic};
}